

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O3

void init_options(void)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = 0;
  do {
    piVar2 = &options[0].type;
    lVar4 = 0;
    iVar1 = 0;
    do {
      if (iVar1 < 0x15 && uVar3 == (uint)*piVar2) {
        lVar5 = (long)iVar1;
        iVar1 = iVar1 + 1;
        option_page[uVar3][lVar5] = (int)lVar4;
      }
      lVar4 = lVar4 + 1;
      piVar2 = piVar2 + 6;
    } while (lVar4 != 0x2d);
    if (iVar1 < 0x15) {
      memset(option_page[uVar3] + iVar1,0,(ulong)(0x14 - iVar1) * 4 + 4);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 3);
  return;
}

Assistant:

void init_options(void)
{
	int opt, page;

	/* Allocate options to pages */
	for (page = 0; page < OPT_PAGE_MAX; page++) {
		int page_opts = 0;
		for (opt = 0; opt < OPT_MAX; opt++) {
			if ((options[opt].type == page) && (page_opts < OPT_PAGE_PER))
				option_page[page][page_opts++] = opt;
		}
		while (page_opts < OPT_PAGE_PER)
			option_page[page][page_opts++] = OPT_none;
	}
}